

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_registry.c
# Opt level: O3

upb_ExtensionRegistryStatus
upb_ExtensionRegistry_AddArray(upb_ExtensionRegistry *r,upb_MiniTableExtension **e,size_t count)

{
  upb_ExtensionRegistryStatus uVar1;
  upb_MiniTableExtension **ppuVar2;
  char buf [12];
  upb_MiniTable *local_40;
  uint32_t local_38;
  
  if (0 < (long)count) {
    ppuVar2 = e;
    do {
      uVar1 = upb_ExtensionRegistry_Add(r,*ppuVar2);
      if (uVar1 != kUpb_ExtensionRegistryStatus_Ok) {
        if (ppuVar2 <= e) {
          return uVar1;
        }
        do {
          local_40 = (*e)->extendee_dont_copy_me__upb_internal_use_only;
          local_38 = ((*e)->field_dont_copy_me__upb_internal_use_only).
                     number_dont_copy_me__upb_internal_use_only;
          upb_strtable_remove2(&r->exts,(char *)&local_40,0xc,(upb_value *)0x0);
          e = e + 1;
        } while (e < ppuVar2);
        return uVar1;
      }
      ppuVar2 = ppuVar2 + 1;
    } while (ppuVar2 < e + count);
  }
  return kUpb_ExtensionRegistryStatus_Ok;
}

Assistant:

upb_ExtensionRegistryStatus upb_ExtensionRegistry_AddArray(
    upb_ExtensionRegistry* r, const upb_MiniTableExtension** e, size_t count) {
  const upb_MiniTableExtension** start = e;
  const upb_MiniTableExtension** end = UPB_PTRADD(e, count);
  upb_ExtensionRegistryStatus status = kUpb_ExtensionRegistryStatus_Ok;
  for (; e < end; e++) {
    status = upb_ExtensionRegistry_Add(r, *e);
    if (status != kUpb_ExtensionRegistryStatus_Ok) goto failure;
  }
  return kUpb_ExtensionRegistryStatus_Ok;

failure:
  // Back out the entries previously added.
  for (end = e, e = start; e < end; e++) {
    const upb_MiniTableExtension* ext = *e;
    char buf[EXTREG_KEY_SIZE];
    extreg_key(buf, ext->UPB_PRIVATE(extendee),
               upb_MiniTableExtension_Number(ext));
    upb_strtable_remove2(&r->exts, buf, EXTREG_KEY_SIZE, NULL);
  }
  UPB_ASSERT(status != kUpb_ExtensionRegistryStatus_Ok);
  return status;
}